

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O0

undefined8 __thiscall svg::Text::toString_abi_cxx11_(Text *this,Layout *layout)

{
  ostream *poVar1;
  Layout *in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  stringstream ss;
  string *in_stack_fffffffffffffc18;
  allocator *element_name;
  allocator local_389;
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [32];
  double local_2c0;
  allocator local_2b1;
  string local_2b0 [32];
  string local_290 [39];
  allocator local_269;
  string *in_stack_fffffffffffffd98;
  double *in_stack_fffffffffffffda0;
  string *in_stack_fffffffffffffda8;
  allocator local_239;
  string local_238 [32];
  string local_218 [55];
  allocator local_1e1;
  string local_1e0 [16];
  Layout *in_stack_fffffffffffffe30;
  Fill *in_stack_fffffffffffffe38;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [48];
  Layout *in_stack_fffffffffffffea0;
  Font *in_stack_fffffffffffffea8;
  Layout *in_stack_ffffffffffffff50;
  Stroke *in_stack_ffffffffffffff58;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"text",&local_1e1);
  elemStart(in_stack_fffffffffffffc18);
  poVar1 = std::operator<<(local_190,local_1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,"x",&local_239);
  translateX(*(double *)(in_RSI + 0x58),in_RDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffd98,"",&local_269);
  attribute<double>(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  poVar1 = std::operator<<(poVar1,local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b0,"y",&local_2b1);
  local_2c0 = translateY(*(double *)(in_RSI + 0x60),in_RDX);
  element_name = &local_2e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e0,"",element_name);
  attribute<double>(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  poVar1 = std::operator<<(poVar1,local_290);
  Fill::toString_abi_cxx11_(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  poVar1 = std::operator<<(poVar1,local_308);
  Stroke::toString_abi_cxx11_(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  poVar1 = std::operator<<(poVar1,local_328);
  Font::toString_abi_cxx11_(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  poVar1 = std::operator<<(poVar1,local_348);
  poVar1 = std::operator<<(poVar1,">");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 0x68));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"text",&local_389);
  elemEnd((string *)element_name);
  std::operator<<(poVar1,local_368);
  std::__cxx11::string::~string(local_368);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  std::__cxx11::string::~string(local_348);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd98);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string toString(Layout const & layout) const
        {
            std::stringstream ss;
            ss << elemStart("text") << attribute("x", translateX(origin.x, layout))
                << attribute("y", translateY(origin.y, layout))
                << fill.toString(layout) << stroke.toString(layout) << font.toString(layout)
                << ">" << content << elemEnd("text");
            return ss.str();
        }